

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::DoTrackNewValueForKills(GlobOpt *this,Value *value)

{
  ValueType *this_00;
  ValueInfo *this_01;
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  ValueType VVar6;
  undefined4 *puVar7;
  Loop *loop;
  Value *local_58;
  Value *local_50;
  Value *value_local;
  undefined4 *local_40;
  byte local_31;
  
  local_50 = value;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3258,"(value)","value");
    if (!bVar3) goto LAB_0046cef7;
    *puVar7 = 0;
  }
  this_01 = local_50->valueInfo;
  this_00 = &this_01->super_ValueType;
  bVar3 = ValueType::IsAnyOptimizedArray(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x325b,"(valueInfo->IsAnyOptimizedArray())",
                       "valueInfo->IsAnyOptimizedArray()");
    if (!bVar3) goto LAB_0046cef7;
    *puVar7 = 0;
  }
  bVar3 = ValueInfo::IsArrayValueInfo(this_01);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x325c,"(!valueInfo->IsArrayValueInfo())","!valueInfo->IsArrayValueInfo()");
    if (!bVar3) goto LAB_0046cef7;
    *puVar7 = 0;
  }
  if (this_01->symStore != (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x325f,"(!valueInfo->GetSymStore())","!valueInfo->GetSymStore()");
    if (!bVar3) goto LAB_0046cef7;
    *puVar7 = 0;
  }
  bVar3 = ValueType::IsArrayOrObjectWithArray(this_00);
  bVar4 = ValueType::IsOptimizedTypedArray(this_00);
  if (bVar3 == bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3262,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                       "!isJsArray == valueInfo->IsOptimizedTypedArray()");
    if (!bVar4) goto LAB_0046cef7;
    *puVar7 = 0;
  }
  bVar5 = ValueType::IsOptimizedVirtualTypedArray(this_00);
  pBVar1 = this->currentBlock->next;
  value_local = (Value *)this_01;
  if ((pBVar1 == (BasicBlock *)0x0) || ((*(ushort *)&pBVar1->field_0x18 & 5) != 4)) {
    loop = this->currentBlock->loop;
  }
  else {
    loop = pBVar1->loop;
    local_31 = bVar5;
    if (loop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_40 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *local_40 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x326c,"(implicitCallsLoop)","implicitCallsLoop");
      if (!bVar4) goto LAB_0046cef7;
      *local_40 = 0;
    }
    bVar5 = local_31;
    if (loop->landingPad != this->currentBlock) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_40 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *local_40 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x326d,"(implicitCallsLoop->landingPad == currentBlock)",
                         "implicitCallsLoop->landingPad == currentBlock");
      if (!bVar4) {
LAB_0046cef7:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *local_40 = 0;
      bVar5 = local_31;
    }
  }
  if ((bVar3 | bVar5) != 1) {
    VerifyArrayValueInfoForTracking(this,(ValueInfo *)value_local,bVar3,this->currentBlock,false);
    return;
  }
  local_31 = bVar5;
  bVar4 = DoArrayCheckHoist(this,(ValueType)
                                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                  &(this_00->field_0).field_0,loop,(Instr *)0x0);
  if (bVar4) {
    if (bVar3) {
      bVar4 = ValueType::HasNoMissingValues(this_00);
      if ((bVar4) && ((this->field_0xf5 & 0x80) == 0)) {
        VVar6 = ValueType::SetHasNoMissingValues(this_00,false);
        (this_00->field_0).field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar6.field_0;
      }
      VerifyArrayValueInfoForTracking(this,(ValueInfo *)value_local,bVar3,this->currentBlock,false);
    }
    else {
      VerifyArrayValueInfoForTracking(this,(ValueInfo *)value_local,false,this->currentBlock,false);
      if (local_31 == 0) {
        return;
      }
    }
    local_58 = local_50;
    JsUtil::
    BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                *)(this->currentBlock->globOptData).valuesToKillOnCalls,&local_58,&local_50);
  }
  else {
    VVar6 = ValueType::ToLikely(this_00);
    (this_00->field_0).field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar6.field_0;
  }
  return;
}

Assistant:

void
GlobOpt::DoTrackNewValueForKills(Value *const value)
{
    Assert(value);

    ValueInfo *const valueInfo = value->GetValueInfo();
    Assert(valueInfo->IsAnyOptimizedArray());
    Assert(!valueInfo->IsArrayValueInfo());

    // The value and value info here are new, so it's okay to modify the value info in-place
    Assert(!valueInfo->GetSymStore());

    const bool isJsArray = valueInfo->IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());

    const bool isVirtualTypedArray = valueInfo->IsOptimizedVirtualTypedArray();

    Loop *implicitCallsLoop;
    if(currentBlock->next && !currentBlock->next->isDeleted && currentBlock->next->isLoopHeader)
    {
        // Since a loop's landing pad does not have user code, determine whether disabling implicit calls is allowed in the
        // landing pad based on the loop for which this block is the landing pad.
        implicitCallsLoop = currentBlock->next->loop;
        Assert(implicitCallsLoop);
        Assert(implicitCallsLoop->landingPad == currentBlock);
    }
    else
    {
        implicitCallsLoop = currentBlock->loop;
    }

    if(isJsArray || isVirtualTypedArray)
    {
        if(!DoArrayCheckHoist(valueInfo->Type(), implicitCallsLoop))
        {
            // Array opts are disabled for this value type, so treat it as an indefinite value type going forward
            valueInfo->Type() = valueInfo->Type().ToLikely();
            return;
        }

        if(isJsArray && valueInfo->HasNoMissingValues() && !DoArrayMissingValueCheckHoist())
        {
            valueInfo->Type() = valueInfo->Type().SetHasNoMissingValues(false);
        }
    }

#if DBG
    VerifyArrayValueInfoForTracking(valueInfo, isJsArray, currentBlock);
#endif

    if(!isJsArray && !isVirtualTypedArray)
    {
        return;
    }

    // Can't assume going forward that it will definitely be an array without disabling implicit calls, because the
    // array may be transformed into an ES5 array. Since array opts are enabled, implicit calls can be disabled, and we can
    // treat it as a definite value type going forward, but the value needs to be tracked so that something like a call can
    // revert the value type to a likely version.
    CurrentBlockData()->valuesToKillOnCalls->Add(value);
}